

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Input::kf_delete_char_left(Fl_Input *this)

{
  if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) == 0) {
    if ((this->super_Fl_Input_).mark_ == (this->super_Fl_Input_).position_) {
      Fl_Input_::cut(&this->super_Fl_Input_,-1);
    }
    else {
      Fl_Input_::cut(&this->super_Fl_Input_);
    }
  }
  else {
    fl_beep(0);
  }
  return 1;
}

Assistant:

int Fl_Input::kf_delete_char_left() {
  if (readonly()) { fl_beep(); return 1; }
  if (mark() != position()) cut();
  else cut(-1);
  return 1;
}